

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

SurfaceInteraction *
pbrt::BilinearPatch::InteractionFromIntersection
          (BilinearPatchMesh *mesh,int patchIndex,Point2f *uv,Float time,Vector3f *wo)

{
  undefined1 auVar1 [16];
  bool bVar2;
  Tuple2<pbrt::Point2,_float> *in_RCX;
  int in_EDX;
  byte *in_RSI;
  SurfaceInteraction *in_RDI;
  Tuple2<pbrt::Point2,_float> *pTVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  type tVar11;
  undefined1 auVar12 [16];
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar16 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 extraout_var_03 [56];
  undefined1 auVar19 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 extraout_var_08 [56];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var_09 [56];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 extraout_var_10 [56];
  undefined1 auVar55 [64];
  undefined1 extraout_var_11 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 extraout_var_12 [56];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 extraout_var_13 [56];
  undefined1 auVar61 [64];
  undefined1 extraout_var_14 [56];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 extraout_var_15 [56];
  undefined1 auVar64 [64];
  undefined1 extraout_var_16 [56];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  Point3<float> PVar72;
  Vector3<float> VVar73;
  Tuple3<pbrt::Vector3,_float> TVar74;
  Normal3<float> NVar75;
  Vector3f sdpdv;
  Vector3f sdpdu;
  Transform r;
  Float sinTheta;
  Float cosTheta;
  Normal3f dndv_1;
  Normal3f dndu_1;
  Vector3f axis;
  Normal3f n;
  Normal3f ns;
  Normal3f n11;
  Normal3f n01;
  Normal3f n10;
  Normal3f n00;
  bool flipNormal;
  int faceIndex;
  Vector3f pError;
  Normal3f dndv;
  Normal3f dndu;
  Float invEGF2;
  Float g;
  Float f;
  Float e;
  Vector3f N;
  Float G;
  Float F;
  Float E;
  Vector3f d2Pduv;
  Vector3f d2Pdvv;
  Vector3f d2Pduu;
  double vb;
  float va;
  Vector3f dpdt;
  Vector3f dpds;
  Float dvdt;
  Float dudt;
  Float dvds;
  Float duds;
  Float dtdv;
  Float dtdu;
  Float dsdv;
  Float dsdu;
  Point2f *uv11;
  Point2f *uv01;
  Point2f *uv10;
  Point2f *uv00;
  Point2f uvTex;
  Vector3f dpdv;
  Vector3f dpdu;
  Point3f pHit;
  Point3f p11;
  Point3f p01;
  Point3f p10;
  Point3f p00;
  int *v;
  SurfaceInteraction *isect;
  Point3<float> *in_stack_fffffffffffff508;
  Normal3<float> *n_00;
  Tuple3<pbrt::Vector3,_float> *in_stack_fffffffffffff510;
  Normal3<float> *n_01;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffff518;
  undefined4 uVar76;
  Normal3<float> *c;
  Tuple3<pbrt::Point3,_float> *in_stack_fffffffffffff520;
  Tuple3<pbrt::Normal3,_float> *pTVar77;
  undefined4 in_stack_fffffffffffff528;
  Float in_stack_fffffffffffff52c;
  Point3fi *in_stack_fffffffffffff530;
  Tuple3<pbrt::Vector3,_float> *v_00;
  Vector3f *in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  Point3fi *in_stack_fffffffffffff548;
  Tuple3<pbrt::Vector3,_float> *b;
  SurfaceInteraction *in_stack_fffffffffffff550;
  Tuple3<pbrt::Vector3,_float> *a;
  char (*in_stack_fffffffffffff558) [6];
  Normal3f *dndvs;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffff560;
  Normal3f *dndus;
  Tuple3<pbrt::Normal3,_float> *in_stack_fffffffffffff568;
  undefined8 in_stack_fffffffffffff570;
  Float t;
  Vector3f *dpdus;
  char *in_stack_fffffffffffff578;
  Tuple3<pbrt::Normal3,_float> *ns_00;
  undefined8 in_stack_fffffffffffff580;
  LogLevel level;
  SurfaceInteraction *this;
  undefined4 in_stack_fffffffffffff590;
  int iVar78;
  undefined4 in_stack_fffffffffffff594;
  undefined1 in_stack_fffffffffffff598 [16];
  double *in_stack_fffffffffffff5a8;
  undefined4 local_a50;
  float local_9f8;
  float local_9f4;
  float local_9f0;
  float local_9ec;
  int in_stack_fffffffffffff618;
  float in_stack_fffffffffffff61c;
  float in_stack_fffffffffffff620;
  float in_stack_fffffffffffff624;
  Vector3f local_910;
  undefined8 local_904;
  float local_8fc;
  undefined8 local_8f8;
  float local_8f0;
  undefined8 local_8e8;
  float local_8e0;
  undefined8 local_8d8;
  float local_8d0;
  undefined8 local_8c8;
  float local_8c0;
  Normal3f local_8b8 [10];
  float local_838;
  type local_834;
  undefined8 local_830;
  float local_828;
  undefined8 local_820;
  float local_818;
  undefined8 local_810;
  float local_808;
  undefined8 local_800;
  float local_7f8;
  undefined8 local_7f0;
  float local_7e8;
  undefined8 local_7e0;
  float local_7d8;
  undefined8 local_7d0;
  float local_7c8;
  undefined8 local_7c0;
  float local_7b8;
  undefined8 local_7b0;
  float local_7a8;
  undefined8 local_7a0;
  float local_798;
  undefined8 local_790;
  float local_788;
  undefined8 local_780;
  float local_778;
  undefined8 local_770;
  float local_768;
  undefined8 local_760;
  float local_758;
  undefined8 local_750;
  float local_748;
  undefined1 local_734 [20];
  float local_720;
  Tuple3<pbrt::Vector3,_float> local_718;
  Tuple3<pbrt::Vector3,_float> local_708;
  Tuple3<pbrt::Normal3,_float> local_6f8;
  Tuple3<pbrt::Normal3,_float> local_6e8;
  Tuple3<pbrt::Normal3,_float> local_6d8 [2];
  float local_6c0;
  undefined8 local_6b8;
  float local_6b0;
  Tuple3<pbrt::Vector3,_float> local_6a8;
  Tuple3<pbrt::Vector3,_float> local_698;
  Tuple3<pbrt::Normal3,_float> local_688 [2];
  undefined4 local_670;
  Tuple3<pbrt::Vector3,_float> local_668;
  Tuple3<pbrt::Vector3,_float> local_658;
  Tuple3<pbrt::Vector3,_float> local_648 [3];
  byte local_61d;
  undefined4 local_61c;
  undefined8 local_618;
  float local_610;
  undefined8 local_608;
  float local_600;
  undefined8 local_5f8;
  float local_5f0;
  undefined8 local_5e8;
  float local_5e0;
  undefined8 local_5d8;
  float local_5d0;
  undefined8 local_5c8;
  float local_5c0;
  undefined8 local_5b8;
  float local_5b0;
  undefined8 local_5a8;
  float local_5a0;
  undefined8 local_598;
  float local_590;
  undefined8 local_588;
  float local_580;
  undefined8 local_578;
  float local_570;
  undefined8 local_568;
  float local_560;
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  float local_540;
  undefined8 local_538;
  float local_530;
  undefined8 local_51c;
  float local_514;
  undefined8 local_510;
  float local_508;
  undefined8 local_500;
  float local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  float local_4d8;
  undefined8 local_4d0;
  float local_4c8;
  undefined8 local_4c0;
  float local_4b8;
  Normal3<float> local_4b4;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  float local_490;
  undefined8 local_488;
  float local_480;
  undefined8 local_478;
  float local_470;
  undefined8 local_468;
  float local_460;
  undefined8 local_458;
  float local_450;
  Normal3<float> local_44c;
  float local_440;
  float local_43c;
  float local_438;
  float local_434;
  Tuple3<pbrt::Vector3,_float> local_430;
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  Tuple3<pbrt::Vector3,_float> local_400;
  float local_3f0;
  float local_3ec;
  float local_3e8;
  Vector3<float> local_3e4;
  Vector3<float> local_3d8;
  Vector3<float> local_3cc;
  undefined8 local_3c0;
  Tuple3<pbrt::Vector3,_float> local_3b8;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  Tuple3<pbrt::Vector3,_float> local_38c;
  Tuple3<pbrt::Vector3,_float> local_380;
  undefined8 local_370;
  float local_368;
  undefined8 local_360;
  float local_358;
  Tuple3<pbrt::Vector3,_float> local_350;
  float local_344;
  Tuple3<pbrt::Vector3,_float> local_340;
  Tuple3<pbrt::Vector3,_float> local_32c;
  Tuple3<pbrt::Vector3,_float> local_320;
  Tuple3<pbrt::Vector3,_float> local_30c;
  Tuple3<pbrt::Vector3,_float> local_300;
  Tuple3<pbrt::Vector3,_float> local_2f0;
  Vector3<float> local_2e4;
  Tuple3<pbrt::Vector3,_float> local_2d8;
  Tuple3<pbrt::Vector3,_float> local_2c4;
  Tuple3<pbrt::Vector3,_float> local_2b8;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  float local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  Tuple3<pbrt::Vector3,_float> local_268;
  Tuple3<pbrt::Vector3,_float> local_258;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  Tuple3<pbrt::Vector3,_float> local_208;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  undefined8 local_1d8;
  undefined8 local_1d0;
  Tuple2<pbrt::Point2,_float> local_1c8;
  Tuple2<pbrt::Point2,_float> *local_1c0;
  Tuple2<pbrt::Point2,_float> *local_1b8;
  Tuple2<pbrt::Point2,_float> *local_1b0;
  Tuple2<pbrt::Point2,_float> *local_1a8;
  Tuple2<pbrt::Point2,_float> local_1a0;
  Tuple3<pbrt::Vector3,_float> local_198;
  undefined8 local_188;
  float local_180;
  undefined8 local_178;
  float local_170;
  undefined8 local_168;
  float local_160;
  undefined8 local_158;
  float local_150;
  Tuple3<pbrt::Vector3,_float> local_14c;
  Tuple3<pbrt::Vector3,_float> local_140;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  Tuple3<pbrt::Vector3,_float> local_f0;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined4 local_48;
  int *local_40;
  Tuple2<pbrt::Point2,_float> *local_28;
  int local_1c;
  byte *local_18;
  undefined1 auVar71 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  Float time_00;
  
  t = (Float)((ulong)in_stack_fffffffffffff570 >> 0x20);
  level = (LogLevel)((ulong)in_stack_fffffffffffff580 >> 0x20);
  local_40 = (int *)(*(long *)(in_RSI + 0x10) + (long)(in_EDX << 2) * 4);
  local_48 = *(undefined4 *)(*(long *)(in_RSI + 0x18) + 8 + (long)*local_40 * 0xc);
  local_50 = *(undefined8 *)(*(long *)(in_RSI + 0x18) + (long)*local_40 * 0xc);
  local_58 = *(undefined4 *)(*(long *)(in_RSI + 0x18) + 8 + (long)local_40[1] * 0xc);
  local_60 = *(undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_40[1] * 0xc);
  local_68 = *(undefined4 *)(*(long *)(in_RSI + 0x18) + 8 + (long)local_40[2] * 0xc);
  local_70 = *(undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_40[2] * 0xc);
  local_78 = *(undefined4 *)(*(long *)(in_RSI + 0x18) + 8 + (long)local_40[3] * 0xc);
  local_80 = *(undefined8 *)(*(long *)(in_RSI + 0x18) + (long)local_40[3] * 0xc);
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  Tuple2<pbrt::Point2,_float>::operator[](in_RCX,0);
  Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
  auVar71 = extraout_var;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_a8 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar13._8_56_ = auVar71;
  local_b0 = vmovlpd_avx(auVar13._0_16_);
  local_a0 = local_b0;
  local_98 = local_a8;
  Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
  auVar71 = extraout_var_00;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_c8 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar71;
  auVar12 = auVar14._0_16_;
  auVar71 = (undefined1  [56])0x0;
  local_d0 = vmovlpd_avx(auVar12);
  local_c0 = local_d0;
  local_b8 = local_c8;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_d8 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar15._8_56_ = auVar71;
  local_e0 = vmovlpd_avx(auVar15._0_16_);
  local_90 = local_e0;
  local_88 = local_d8;
  Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
  auVar71 = extraout_var_01;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_108 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar16._8_56_ = auVar71;
  local_110 = vmovlpd_avx(auVar16._0_16_);
  local_100 = local_110;
  local_f8 = local_108;
  Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
  auVar71 = extraout_var_02;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_128 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = auVar71;
  local_130 = vmovlpd_avx(auVar17._0_16_);
  local_120 = local_130;
  local_118 = local_128;
  VVar73 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff520,
                      (Point3<float> *)in_stack_fffffffffffff518);
  local_140.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = auVar71;
  local_140._0_8_ = vmovlpd_avx(auVar18._0_16_);
  local_f0._0_8_ = local_140._0_8_;
  local_f0.z = local_140.z;
  Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
  auVar71 = extraout_var_03;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_160 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar19._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar19._8_56_ = auVar71;
  local_168 = vmovlpd_avx(auVar19._0_16_);
  local_158 = local_168;
  local_150 = local_160;
  Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
  auVar71 = extraout_var_04;
  PVar72 = Lerp<pbrt::Point3,float>
                     (t,(Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff568,
                      (Tuple3<pbrt::Point3,_float> *)in_stack_fffffffffffff560);
  local_180 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = auVar71;
  local_188 = vmovlpd_avx(auVar20._0_16_);
  local_178 = local_188;
  local_170 = local_180;
  VVar73 = Point3<float>::operator-
                     ((Point3<float> *)in_stack_fffffffffffff520,
                      (Point3<float> *)in_stack_fffffffffffff518);
  local_198.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar71;
  local_198._0_8_ = vmovlpd_avx(auVar21._0_16_);
  local_1a0 = *local_28;
  local_14c._0_8_ = local_198._0_8_;
  local_14c.z = local_198.z;
  if (*(long *)(local_18 + 0x28) != 0) {
    local_1a8 = (Tuple2<pbrt::Point2,_float> *)(*(long *)(local_18 + 0x28) + (long)*local_40 * 8);
    local_1b0 = (Tuple2<pbrt::Point2,_float> *)(*(long *)(local_18 + 0x28) + (long)local_40[1] * 8);
    local_1b8 = (Tuple2<pbrt::Point2,_float> *)(*(long *)(local_18 + 0x28) + (long)local_40[2] * 8);
    local_1c0 = (Tuple2<pbrt::Point2,_float> *)(*(long *)(local_18 + 0x28) + (long)local_40[3] * 8);
    in_stack_fffffffffffff61c = Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
    in_stack_fffffffffffff618 = 1;
    Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
    auVar22._0_8_ =
         Lerp<pbrt::Point2,float>
                   (in_stack_fffffffffffff52c,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff520,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff518);
    auVar22._8_56_ = extraout_var_05;
    local_1d0 = vmovlpd_avx(auVar22._0_16_);
    Tuple2<pbrt::Point2,_float>::operator[](local_28,in_stack_fffffffffffff618);
    auVar23._0_8_ =
         Lerp<pbrt::Point2,float>
                   (in_stack_fffffffffffff52c,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff520,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff518);
    auVar23._8_56_ = extraout_var_06;
    local_1d8 = vmovlpd_avx(auVar23._0_16_);
    auVar24._0_8_ =
         Lerp<pbrt::Point2,float>
                   (in_stack_fffffffffffff52c,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff520,
                    (Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffff518);
    auVar24._8_56_ = extraout_var_07;
    local_1c8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar24._0_16_);
    local_1a0 = local_1c8;
    in_stack_fffffffffffff620 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,0);
    in_stack_fffffffffffff620 = -in_stack_fffffffffffff620;
    fVar4 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,0);
    fVar4 = in_stack_fffffffffffff620 + fVar4;
    fVar5 = Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
    in_stack_fffffffffffff624 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,0);
    fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,0);
    fVar6 = in_stack_fffffffffffff624 - fVar6;
    fVar7 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,0);
    fVar8 = Tuple2<pbrt::Point2,_float>::operator[](local_1c0,0);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)((fVar6 - fVar7) + fVar8)),ZEXT416((uint)fVar5),
                             ZEXT416((uint)fVar4));
    local_1dc = auVar1._0_4_;
    fVar4 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,0);
    fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,0);
    fVar5 = Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
    fVar7 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,0);
    fVar8 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,0);
    fVar9 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,0);
    fVar10 = Tuple2<pbrt::Point2,_float>::operator[](local_1c0,0);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(((fVar7 - fVar8) - fVar9) + fVar10)),
                             ZEXT416((uint)fVar5),ZEXT416((uint)(-fVar4 + fVar6)));
    local_1e0 = auVar1._0_4_;
    fVar4 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,1);
    fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,1);
    fVar5 = Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
    fVar7 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,1);
    fVar8 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,1);
    fVar9 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,1);
    fVar10 = Tuple2<pbrt::Point2,_float>::operator[](local_1c0,1);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(((fVar7 - fVar8) - fVar9) + fVar10)),
                             ZEXT416((uint)fVar5),ZEXT416((uint)(-fVar4 + fVar6)));
    local_1e4 = auVar1._0_4_;
    fVar4 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,1);
    fVar6 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,1);
    fVar5 = Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
    fVar7 = Tuple2<pbrt::Point2,_float>::operator[](local_1a8,1);
    fVar8 = Tuple2<pbrt::Point2,_float>::operator[](local_1b8,1);
    fVar9 = Tuple2<pbrt::Point2,_float>::operator[](local_1b0,1);
    pTVar3 = local_1c0;
    fVar10 = Tuple2<pbrt::Point2,_float>::operator[](local_1c0,1);
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(((fVar7 - fVar8) - fVar9) + fVar10)),
                             ZEXT416((uint)fVar5),ZEXT416((uint)(-fVar4 + fVar6)));
    local_1e8 = auVar1._0_4_;
    iVar78 = (int)pTVar3;
    fVar4 = local_1dc;
    std::abs(iVar78);
    if (1e-08 <= fVar4) {
      local_9ec = 1.0 / local_1dc;
    }
    else {
      local_9ec = 0.0;
    }
    local_1ec = local_9ec;
    fVar4 = local_1e0;
    std::abs(iVar78);
    if (1e-08 <= fVar4) {
      local_9f0 = 1.0 / local_1e0;
    }
    else {
      local_9f0 = 0.0;
    }
    local_1f0 = local_9f0;
    fVar4 = local_1e4;
    std::abs(iVar78);
    if (1e-08 <= fVar4) {
      local_9f4 = 1.0 / local_1e4;
    }
    else {
      local_9f4 = 0.0;
    }
    local_1f4 = local_9f4;
    fVar4 = local_1e8;
    std::abs(iVar78);
    if (1e-08 <= fVar4) {
      local_9f8 = 1.0 / local_1e8;
    }
    else {
      local_9f8 = 0.0;
    }
    local_1f8 = local_9f8;
    auVar71 = (undefined1  [56])0x0;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
    local_220 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar25._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar25._8_56_ = auVar71;
    local_228 = vmovlpd_avx(auVar25._0_16_);
    auVar71 = (undefined1  [56])0x0;
    local_218 = local_228;
    local_210 = local_220;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
    local_240 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar26._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar26._8_56_ = auVar71;
    local_248 = vmovlpd_avx(auVar26._0_16_);
    local_238 = local_248;
    local_230 = local_240;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (Vector3<float> *)in_stack_fffffffffffff518);
    local_258.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar27._8_56_ = auVar71;
    local_258._0_8_ = vmovlpd_avx(auVar27._0_16_);
    auVar71 = (undefined1  [56])0x0;
    local_208._0_8_ = local_258._0_8_;
    local_208.z = local_258.z;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
    local_280 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar28._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar28._8_56_ = auVar71;
    local_288 = vmovlpd_avx(auVar28._0_16_);
    auVar71 = (undefined1  [56])0x0;
    local_278 = local_288;
    local_270 = local_280;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator*
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (float)((ulong)in_stack_fffffffffffff518 >> 0x20));
    local_2a0 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar29._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar29._8_56_ = auVar71;
    local_2a8 = vmovlpd_avx(auVar29._0_16_);
    local_298 = local_2a8;
    local_290 = local_2a0;
    VVar73 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                        (Vector3<float> *)in_stack_fffffffffffff518);
    local_2b8.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar30._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar30._8_56_ = auVar71;
    local_2b8._0_8_ = vmovlpd_avx(auVar30._0_16_);
    local_268._0_8_ = local_2b8._0_8_;
    local_268.z = local_2b8.z;
    VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                          (Vector3<float> *)in_stack_fffffffffffff518);
    local_2d8.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar31._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar31._8_56_ = auVar71;
    local_2d8._0_8_ = vmovlpd_avx(auVar31._0_16_);
    auVar71 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
    local_2c4._0_8_ = local_2d8._0_8_;
    local_2c4.z = local_2d8.z;
    Vector3<float>::Vector3
              ((Vector3<float> *)in_stack_fffffffffffff510,
               (float)((ulong)in_stack_fffffffffffff508 >> 0x20),SUB84(in_stack_fffffffffffff508,0),
               0.0);
    bVar2 = Tuple3<pbrt::Vector3,_float>::operator!=(&local_2c4,&local_2e4);
    if (bVar2) {
      VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                            (Vector3<float> *)in_stack_fffffffffffff518);
      local_300.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar32._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar32._8_56_ = auVar71;
      local_300._0_8_ = vmovlpd_avx(auVar32._0_16_);
      local_2f0._0_8_ = local_300._0_8_;
      local_2f0.z = local_300.z;
      VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                            (Vector3<float> *)in_stack_fffffffffffff518);
      local_320.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar33._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar71;
      local_320._0_8_ = vmovlpd_avx(auVar33._0_16_);
      local_30c._0_8_ = local_320._0_8_;
      local_30c.z = local_320.z;
      fVar4 = Dot<float>((Vector3<float> *)&local_2f0,(Vector3<float> *)&local_30c);
      auVar71 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
      if (fVar4 < 0.0) {
        VVar73 = Tuple3<pbrt::Vector3,_float>::operator-(in_stack_fffffffffffff510);
        local_340.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar34._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar34._8_56_ = auVar71;
        local_340._0_8_ = vmovlpd_avx(auVar34._0_16_);
        local_32c._0_8_ = local_340._0_8_;
        local_32c.z = local_340.z;
        local_268._0_8_ = local_340._0_8_;
        local_268.z = local_340.z;
      }
      VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                            (Vector3<float> *)in_stack_fffffffffffff518);
      local_368 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar35._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar35._8_56_ = auVar71;
      local_370 = vmovlpd_avx(auVar35._0_16_);
      local_360 = local_370;
      local_358 = local_368;
      VVar73 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff530);
      local_380.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar36._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar36._8_56_ = auVar71;
      local_380._0_8_ = vmovlpd_avx(auVar36._0_16_);
      local_350._0_8_ = local_380._0_8_;
      local_350.z = local_380.z;
      VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                            (Vector3<float> *)in_stack_fffffffffffff518);
      local_3a0 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar37._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar71;
      local_3a8 = vmovlpd_avx(auVar37._0_16_);
      local_398 = local_3a8;
      local_390 = local_3a0;
      VVar73 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff530);
      local_3b8.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar38._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar38._8_56_ = auVar71;
      local_3b8._0_8_ = vmovlpd_avx(auVar38._0_16_);
      local_38c._0_8_ = local_3b8._0_8_;
      local_38c.z = local_3b8.z;
      local_344 = Dot<float>((Vector3<float> *)&local_350,(Vector3<float> *)&local_38c);
      local_3c0 = 0xbf50624dd2f1a9fc;
      if (local_344 < -0.001) {
        LogFatal<char_const(&)[64],char_const(&)[6],char_const(&)[64],float&,char_const(&)[6],double&>
                  (level,in_stack_fffffffffffff578,(int)t,(char *)in_stack_fffffffffffff568,
                   (char (*) [64])in_stack_fffffffffffff560,in_stack_fffffffffffff558,
                   (char (*) [64])CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
                   in_stack_fffffffffffff598._0_8_,in_stack_fffffffffffff598._8_8_,
                   in_stack_fffffffffffff5a8);
      }
      local_f0.x = local_208.x;
      local_f0.y = local_208.y;
      local_f0.z = local_208.z;
      local_14c.x = local_268.x;
      local_14c.y = local_268.y;
      local_14c.z = local_268.z;
    }
  }
  iVar78 = (int)in_stack_fffffffffffff578;
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff510,
             (float)((ulong)in_stack_fffffffffffff508 >> 0x20),SUB84(in_stack_fffffffffffff508,0),
             0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff510,
             (float)((ulong)in_stack_fffffffffffff508 >> 0x20),SUB84(in_stack_fffffffffffff508,0),
             0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)in_stack_fffffffffffff510,
             (float)((ulong)in_stack_fffffffffffff508 >> 0x20),SUB84(in_stack_fffffffffffff508,0),
             0.0);
  local_3e8 = Dot<float>((Vector3<float> *)&local_f0,(Vector3<float> *)&local_f0);
  local_3ec = Dot<float>((Vector3<float> *)&local_f0,(Vector3<float> *)&local_14c);
  local_3f0 = Dot<float>((Vector3<float> *)&local_14c,(Vector3<float> *)&local_14c);
  auVar71 = extraout_var_08;
  VVar73 = Cross<float>((Vector3<float> *)in_stack_fffffffffffff520,
                        (Vector3<float> *)in_stack_fffffffffffff518);
  local_418 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar39._8_56_ = auVar71;
  local_420 = vmovlpd_avx(auVar39._0_16_);
  local_410 = local_420;
  local_408 = local_418;
  VVar73 = Normalize<float>((Vector3<float> *)in_stack_fffffffffffff530);
  local_430.z = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar40._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar40._8_56_ = auVar71;
  local_430._0_8_ = vmovlpd_avx(auVar40._0_16_);
  local_400._0_8_ = local_430._0_8_;
  local_400.z = local_430.z;
  local_434 = Dot<float>((Vector3<float> *)&local_400,&local_3cc);
  local_438 = Dot<float>((Vector3<float> *)&local_400,&local_3e4);
  local_43c = Dot<float>((Vector3<float> *)&local_400,&local_3d8);
  auVar1 = vfmsub213ss_fma(ZEXT416((uint)local_3f0),ZEXT416((uint)local_3e8),
                           ZEXT416((uint)(local_3ec * local_3ec)));
  local_440 = 1.0 / auVar1._0_4_;
  vfmsub213ss_fma(ZEXT416((uint)local_3ec),ZEXT416((uint)local_438),
                  ZEXT416((uint)(local_434 * local_3f0)));
  auVar71 = (undefined1  [56])0x0;
  VVar73 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff530 >> 0x20),
                           (Tuple3<pbrt::Vector3,_float> *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  local_470 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar41._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar41._8_56_ = auVar71;
  local_478 = vmovlpd_avx(auVar41._0_16_);
  vfmsub213ss_fma(ZEXT416((uint)local_3ec),ZEXT416((uint)local_434),
                  ZEXT416((uint)(local_438 * local_3e8)));
  auVar71 = (undefined1  [56])0x0;
  local_468 = local_478;
  local_460 = local_470;
  VVar73 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff530 >> 0x20),
                           (Tuple3<pbrt::Vector3,_float> *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  local_490 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar42._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar42._8_56_ = auVar71;
  local_498 = vmovlpd_avx(auVar42._0_16_);
  local_488 = local_498;
  local_480 = local_490;
  VVar73 = Tuple3<pbrt::Vector3,float>::operator+
                     ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                      (Vector3<float> *)in_stack_fffffffffffff518);
  local_4a0 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar43._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar43._8_56_ = auVar71;
  local_4a8 = vmovlpd_avx(auVar43._0_16_);
  local_458 = local_4a8;
  local_450 = local_4a0;
  Normal3<float>::Normal3<float>
            ((Normal3<float> *)in_stack_fffffffffffff510,(Vector3<float> *)in_stack_fffffffffffff508
            );
  vfmsub213ss_fma(ZEXT416((uint)local_3ec),ZEXT416((uint)local_43c),
                  ZEXT416((uint)(local_438 * local_3f0)));
  auVar71 = (undefined1  [56])0x0;
  VVar73 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff530 >> 0x20),
                           (Tuple3<pbrt::Vector3,_float> *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  local_4d8 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar44._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar44._8_56_ = auVar71;
  local_4e0 = vmovlpd_avx(auVar44._0_16_);
  vfmsub213ss_fma(ZEXT416((uint)local_3ec),ZEXT416((uint)local_438),
                  ZEXT416((uint)(local_43c * local_3e8)));
  auVar71 = (undefined1  [56])0x0;
  local_4d0 = local_4e0;
  local_4c8 = local_4d8;
  VVar73 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff530 >> 0x20),
                           (Tuple3<pbrt::Vector3,_float> *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  local_4f8 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar45._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar45._8_56_ = auVar71;
  local_500 = vmovlpd_avx(auVar45._0_16_);
  local_4f0 = local_500;
  local_4e8 = local_4f8;
  TVar74 = (Tuple3<pbrt::Vector3,_float>)
           Tuple3<pbrt::Vector3,float>::operator+
                     ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff520,
                      (Vector3<float> *)in_stack_fffffffffffff518);
  local_508 = TVar74.z;
  auVar46._0_8_ = TVar74._0_8_;
  auVar46._8_56_ = auVar71;
  local_510 = vmovlpd_avx(auVar46._0_16_);
  local_4c0 = local_510;
  local_4b8 = local_508;
  Normal3<float>::Normal3<float>
            ((Normal3<float> *)in_stack_fffffffffffff510,(Vector3<float> *)in_stack_fffffffffffff508
            );
  pbrt::gamma(TVar74._0_8_);
  auVar71 = extraout_var_09;
  PVar72 = Abs<pbrt::Point3,float>(in_stack_fffffffffffff520);
  local_560 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar47._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar47._8_56_ = auVar71;
  local_568 = vmovlpd_avx(auVar47._0_16_);
  local_558 = local_568;
  local_550 = local_560;
  PVar72 = Abs<pbrt::Point3,float>(in_stack_fffffffffffff520);
  local_580 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar48._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar48._8_56_ = auVar71;
  local_588 = vmovlpd_avx(auVar48._0_16_);
  local_578 = local_588;
  local_570 = local_580;
  PVar72 = Max<pbrt::Point3,float>(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_590 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar49._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar49._8_56_ = auVar71;
  local_598 = vmovlpd_avx(auVar49._0_16_);
  local_548 = local_598;
  local_540 = local_590;
  PVar72 = Abs<pbrt::Point3,float>(in_stack_fffffffffffff520);
  local_5c0 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar50._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar50._8_56_ = auVar71;
  local_5c8 = vmovlpd_avx(auVar50._0_16_);
  local_5b8 = local_5c8;
  local_5b0 = local_5c0;
  PVar72 = Abs<pbrt::Point3,float>(in_stack_fffffffffffff520);
  local_5e0 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar51._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar51._8_56_ = auVar71;
  local_5e8 = vmovlpd_avx(auVar51._0_16_);
  local_5d8 = local_5e8;
  local_5d0 = local_5e0;
  PVar72 = Max<pbrt::Point3,float>(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  local_5f0 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar52._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar52._8_56_ = auVar71;
  local_5f8 = vmovlpd_avx(auVar52._0_16_);
  local_5a8 = local_5f8;
  local_5a0 = local_5f0;
  PVar72 = Max<pbrt::Point3,float>(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
  uVar76 = (undefined4)((ulong)in_stack_fffffffffffff518 >> 0x20);
  local_600 = PVar72.super_Tuple3<pbrt::Point3,_float>.z;
  auVar53._0_8_ = PVar72.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar53._8_56_ = auVar71;
  local_608 = vmovlpd_avx(auVar53._0_16_);
  local_538 = local_608;
  local_530 = local_600;
  Vector3<float>::Vector3<float>
            ((Vector3<float> *)in_stack_fffffffffffff510,in_stack_fffffffffffff508);
  auVar71 = (undefined1  [56])0x0;
  VVar73 = pbrt::operator*((float)((ulong)in_stack_fffffffffffff530 >> 0x20),
                           (Tuple3<pbrt::Vector3,_float> *)
                           CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528));
  local_610 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar54._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar54._8_56_ = auVar71;
  local_618 = vmovlpd_avx(auVar54._0_16_);
  if (*(long *)(local_18 + 0x30) == 0) {
    local_a50 = 0;
  }
  else {
    local_a50 = *(undefined4 *)(*(long *)(local_18 + 0x30) + (long)local_1c * 4);
  }
  local_61c = local_a50;
  local_61d = (*local_18 & 1) != (local_18[1] & 1);
  local_51c = local_618;
  local_514 = local_610;
  Point3fi::Point3fi(in_stack_fffffffffffff530,
                     (Point3f *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                     (Vector3f *)in_stack_fffffffffffff520);
  n_00 = &local_44c;
  n_01 = &local_4b4;
  c = (Normal3<float> *)CONCAT44(uVar76,(uint)(local_61d & 1));
  time_00 = (Float)((ulong)in_stack_fffffffffffff520 >> 0x20);
  pTVar77 = (Tuple3<pbrt::Normal3,_float> *)CONCAT44(time_00,local_61c);
  SurfaceInteraction::SurfaceInteraction
            (in_stack_fffffffffffff550,in_stack_fffffffffffff548,
             (Point2f *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
             in_stack_fffffffffffff538,(Vector3f *)in_stack_fffffffffffff530,
             (Vector3f *)CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
             (Normal3f *)in_stack_fffffffffffff560,(Normal3f *)in_stack_fffffffffffff568,time_00,
             SUB41((uint)local_61c >> 0x18,0),iVar78);
  if (*(long *)(local_18 + 0x20) != 0) {
    local_648[0].z = *(Float *)(*(long *)(local_18 + 0x20) + 8 + (long)*local_40 * 0xc);
    local_648[0]._0_8_ = *(undefined8 *)(*(long *)(local_18 + 0x20) + (long)*local_40 * 0xc);
    local_658.z = *(float *)(*(long *)(local_18 + 0x20) + 8 + (long)local_40[1] * 0xc);
    local_658._0_8_ = *(undefined8 *)(*(long *)(local_18 + 0x20) + (long)local_40[1] * 0xc);
    local_668.z = *(float *)(*(long *)(local_18 + 0x20) + 8 + (long)local_40[2] * 0xc);
    local_668._0_8_ = *(undefined8 *)(*(long *)(local_18 + 0x20) + (long)local_40[2] * 0xc);
    local_670 = *(undefined4 *)(*(long *)(local_18 + 0x20) + 8 + (long)local_40[3] * 0xc);
    local_688[1]._4_8_ = *(undefined8 *)(*(long *)(local_18 + 0x20) + (long)local_40[3] * 0xc);
    Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
    iVar78 = 1;
    Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
    auVar71 = extraout_var_10;
    NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
    local_6a8.z = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar55._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar55._8_56_ = auVar71;
    local_6a8._0_8_ = vmovlpd_avx(auVar55._0_16_);
    local_698._0_8_ = local_6a8._0_8_;
    local_698.z = local_6a8.z;
    Tuple2<pbrt::Point2,_float>::operator[](local_28,iVar78);
    auVar71 = extraout_var_11;
    NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
    local_6c0 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar56._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar56._8_56_ = auVar71;
    auVar71 = (undefined1  [56])0x0;
    local_6d8[1]._4_8_ = vmovlpd_avx(auVar56._0_16_);
    local_6b8 = local_6d8[1]._4_8_;
    local_6b0 = local_6c0;
    NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
    local_6d8[0].z = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar57._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar57._8_56_ = auVar71;
    local_6d8[0]._0_8_ = vmovlpd_avx(auVar57._0_16_);
    local_688[0]._0_8_ = local_6d8[0]._0_8_;
    local_688[0].z = local_6d8[0].z;
    tVar11 = LengthSquared<float>(n_01);
    if (0.0 < tVar11) {
      ns_00 = local_688;
      auVar71 = extraout_var_12;
      NVar75 = Normalize<float>((Normal3<float> *)in_stack_fffffffffffff530);
      local_6f8.z = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar58._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar58._8_56_ = auVar71;
      local_6f8._0_8_ = vmovlpd_avx(auVar58._0_16_);
      local_6e8._0_8_ = local_6f8._0_8_;
      local_6e8.z = local_6f8.z;
      local_688[0]._0_8_ = local_6f8._0_8_;
      local_688[0].z = local_6f8.z;
      NVar75 = Normalize<float>((Normal3<float> *)in_stack_fffffffffffff530);
      local_718.z = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar59._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar59._8_56_ = auVar71;
      local_718._0_8_ = vmovlpd_avx(auVar59._0_16_);
      this = (SurfaceInteraction *)local_734;
      local_708._0_8_ = local_718._0_8_;
      local_708.z = local_718.z;
      Vector3<float>::Vector3<float>((Vector3<float> *)n_01,n_00);
      Vector3<float>::Vector3<float>((Vector3<float> *)n_01,n_00);
      VVar73 = Cross<float>((Vector3<float> *)pTVar77,(Vector3<float> *)c);
      local_748 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar60._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar60._8_56_ = auVar71;
      local_750 = vmovlpd_avx(auVar60._0_16_);
      local_734._12_8_ = local_750;
      local_720 = local_748;
      fVar4 = LengthSquared<float>((Vector3<float> *)(local_734 + 0xc));
      if (1e-14 < fVar4) {
        iVar78 = 1;
        Tuple2<pbrt::Point2,_float>::operator[](local_28,1);
        a = &local_658;
        auVar71 = extraout_var_13;
        NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        local_778 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar61._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar61._8_56_ = auVar71;
        local_780 = vmovlpd_avx(auVar61._0_16_);
        local_770 = local_780;
        local_768 = local_778;
        Tuple2<pbrt::Point2,_float>::operator[](local_28,iVar78);
        b = local_648;
        v_00 = &local_668;
        auVar71 = extraout_var_14;
        NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        local_798 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar62._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar62._8_56_ = auVar71;
        local_7a0 = vmovlpd_avx(auVar62._0_16_);
        local_790 = local_7a0;
        local_788 = local_798;
        NVar75 = Tuple3<pbrt::Normal3,float>::operator-(pTVar77,c);
        local_7a8 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar63._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar63._8_56_ = auVar71;
        local_7b0 = vmovlpd_avx(auVar63._0_16_);
        iVar78 = 0;
        local_760 = local_7b0;
        local_758 = local_7a8;
        Tuple2<pbrt::Point2,_float>::operator[](local_28,0);
        auVar71 = extraout_var_15;
        NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        local_7d8 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar64._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar64._8_56_ = auVar71;
        local_7e0 = vmovlpd_avx(auVar64._0_16_);
        local_7d0 = local_7e0;
        local_7c8 = local_7d8;
        Tuple2<pbrt::Point2,_float>::operator[](local_28,iVar78);
        auVar71 = extraout_var_16;
        NVar75 = Lerp<pbrt::Normal3,float>(t,in_stack_fffffffffffff568,in_stack_fffffffffffff560);
        local_7f8 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar65._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar65._8_56_ = auVar71;
        local_800 = vmovlpd_avx(auVar65._0_16_);
        local_7f0 = local_800;
        local_7e8 = local_7f8;
        NVar75 = Tuple3<pbrt::Normal3,float>::operator-(pTVar77,c);
        local_808 = NVar75.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar66._0_8_ = NVar75.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar66._8_56_ = auVar71;
        local_810 = vmovlpd_avx(auVar66._0_16_);
        dndvs = (Normal3f *)(local_734 + 0xc);
        local_7c0 = local_810;
        local_7b8 = local_808;
        VVar73 = Normalize<float>((Vector3<float> *)v_00);
        local_828 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar67._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar67._8_56_ = auVar71;
        local_830 = vmovlpd_avx(auVar67._0_16_);
        pTVar77 = local_688;
        local_820 = local_830;
        local_818 = local_828;
        local_734._12_8_ = local_830;
        local_720 = local_828;
        local_834 = Dot<float>(n_01,n_00);
        vfnmadd213ss_fma(ZEXT416((uint)local_834),ZEXT416((uint)local_834),
                         SUB6416(ZEXT464(0x3f800000),0));
        local_838 = SafeSqrt(0.0);
        auVar71 = (undefined1  [56])0x0;
        dndus = local_8b8;
        Rotate(auVar12._12_4_,auVar12._8_4_,auVar12._0_8_);
        VVar73 = Transform::operator()
                           ((Transform *)
                            CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        local_8d0 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar68._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar68._8_56_ = auVar71;
        local_8d8 = vmovlpd_avx(auVar68._0_16_);
        local_8c8 = local_8d8;
        local_8c0 = local_8d0;
        VVar73 = Transform::operator()
                           ((Transform *)
                            CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
                            (Vector3<float> *)
                            CONCAT44(in_stack_fffffffffffff61c,in_stack_fffffffffffff618));
        local_8f0 = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar69._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar69._8_56_ = auVar71;
        local_8f8 = vmovlpd_avx(auVar69._0_16_);
        dpdus = &local_910;
        local_8e8 = local_8f8;
        local_8e0 = local_8f0;
        Vector3<float>::Vector3<float>((Vector3<float> *)n_01,n_00);
        VVar73 = GramSchmidt<float>((Vector3<float> *)a,(Vector3<float> *)b);
        local_8fc = VVar73.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar70._0_8_ = VVar73.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar70._8_56_ = auVar71;
        local_904 = vmovlpd_avx(auVar70._0_16_);
        local_8c8 = local_904;
        local_8c0 = local_8fc;
        SurfaceInteraction::SetShadingGeometry
                  (this,(Normal3f *)ns_00,dpdus,(Vector3f *)pTVar77,dndus,dndvs,
                   SUB81((ulong)a >> 0x38,0));
      }
    }
  }
  return in_RDI;
}

Assistant:

InteractionFromIntersection(const BilinearPatchMesh *mesh,
                                                          int patchIndex,
                                                          const Point2f &uv, Float time,
                                                          const Vector3f &wo) {
        // Compute bilinear patch intersection point, $\dpdu$, and $\dpdv$
        const int *v = &mesh->vertexIndices[4 * patchIndex];
        Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]], p01 = mesh->p[v[2]],
                p11 = mesh->p[v[3]];
        Point3f pHit = Lerp(uv[0], Lerp(uv[1], p00, p01), Lerp(uv[1], p10, p11));
        Vector3f dpdu = Lerp(uv[1], p10, p11) - Lerp(uv[1], p00, p01);
        Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);

        Point2f uvTex = uv;
        if (mesh->uv != nullptr) {
            // Compute texture coordinates for bilinear patch intersection point
            const Point2f &uv00 = mesh->uv[v[0]], &uv10 = mesh->uv[v[1]];
            const Point2f &uv01 = mesh->uv[v[2]], &uv11 = mesh->uv[v[3]];
            uvTex = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
            // Update bilinear patch $\dpdu$ and $\dpdv$ accounting for texture
            // coordinates Compute partial derivatives of $(u,v)$ with respect to
            // interpolated texture coordinates
            Float dsdu =
                -uv00[0] + uv10[0] + uv[1] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dsdv =
                -uv00[0] + uv01[0] + uv[0] * (uv00[0] - uv01[0] - uv10[0] + uv11[0]);
            Float dtdu =
                -uv00[1] + uv10[1] + uv[1] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float dtdv =
                -uv00[1] + uv01[1] + uv[0] * (uv00[1] - uv01[1] - uv10[1] + uv11[1]);
            Float duds = std::abs(dsdu) < 1e-8f ? 0 : 1 / dsdu;
            Float dvds = std::abs(dsdv) < 1e-8f ? 0 : 1 / dsdv;
            Float dudt = std::abs(dtdu) < 1e-8f ? 0 : 1 / dtdu;
            Float dvdt = std::abs(dtdv) < 1e-8f ? 0 : 1 / dtdv;

            // Compute partial derivatives of $\pt{}$ with respect to interpolated texture
            // coordinates
            Vector3f dpds = dpdu * duds + dpdv * dvds;
            Vector3f dpdt = dpdu * dudt + dpdv * dvdt;

            // Set _dpdu_ and _dpdt_ to updated partial derivatives
            if (Cross(dpds, dpdt) != Vector3f(0, 0, 0)) {
                if (Dot(Cross(dpdu, dpdv), Cross(dpds, dpdt)) < 0)
                    dpdt = -dpdt;
                CHECK_GE(Dot(Normalize(Cross(dpdu, dpdv)), Normalize(Cross(dpds, dpdt))),
                         -1e-3);
                dpdu = dpds;
                dpdv = dpdt;
            }
        }
        // Find partial derivatives $\dndu$ and $\dndv$ for bilinear patch
        Vector3f d2Pduu(0, 0, 0), d2Pdvv(0, 0, 0);
        Vector3f d2Pduv(p00.x - p01.x - p10.x + p11.x, p00.y - p01.y - p10.y + p11.y,
                        p00.z - p01.z - p10.z + p11.z);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Initialize bilinear patch intersection point error _pError_
        Vector3f pError =
            gamma(4) * Vector3f(Max(Max(Abs(p00), Abs(p10)), Max(Abs(p01), Abs(p11))));

        // Initialize _SurfaceInteraction_ for bilinear patch intersection
        int faceIndex = mesh->faceIndices ? mesh->faceIndices[patchIndex] : 0;
        bool flipNormal = mesh->reverseOrientation ^ mesh->transformSwapsHandedness;
        SurfaceInteraction isect(Point3fi(pHit, pError), uvTex, wo, dpdu, dpdv, dndu,
                                 dndv, time, flipNormal, faceIndex);

        if (mesh->n != nullptr) {
            // Compute shading normals for bilinear patch intersection point
            Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]], n01 = mesh->n[v[2]],
                     n11 = mesh->n[v[3]];
            Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
            if (LengthSquared(ns) > 0) {
                ns = Normalize(ns);
                Normal3f n = Normal3f(Normalize(isect.n));
                Vector3f axis = Cross(Vector3f(n), Vector3f(ns));
                if (LengthSquared(axis) > 1e-14f) {
                    // Set shading geometry for bilinear patch intersection
                    Normal3f dndu = Lerp(uv[1], n10, n11) - Lerp(uv[1], n00, n01);
                    Normal3f dndv = Lerp(uv[0], n01, n11) - Lerp(uv[0], n00, n10);
                    axis = Normalize(axis);
                    Float cosTheta = Dot(n, ns),
                          sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
                    Transform r = Rotate(sinTheta, cosTheta, axis);
                    Vector3f sdpdu = r(dpdu), sdpdv = r(dpdv);
                    sdpdu = GramSchmidt(sdpdu, Vector3f(ns));
                    isect.SetShadingGeometry(ns, sdpdu, sdpdv, dndu, dndv, true);
                }
            }
        }
        return isect;
    }